

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmos.cc
# Opt level: O0

void __thiscall chipemu::implementation::nmos::nmos(nmos *this,void **vtt,chip_description *desc)

{
  uint uVar1;
  uint16_t *puVar2;
  tuple<std::vector<unsigned_short,std::allocator<unsigned_short>>&,std::vector<unsigned_short,std::allocator<unsigned_short>>&>
  local_88 [16];
  pair<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_78;
  undefined1 local_38 [8];
  vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
  cnodes;
  chip_description *desc_local;
  void **vtt_local;
  nmos *this_local;
  
  *(void **)this = *vtt;
  *(void **)(&this->field_0x0 + *(long *)(*(long *)this + -0x48)) = vtt[1];
  cnodes.
  super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)desc;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->changed_queue);
  __gnu_cxx::
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  ::__normal_iterator(&this->changed_eating);
  __gnu_cxx::
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  ::__normal_iterator(&this->changed_feeding);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->current_group);
  __gnu_cxx::
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  ::__normal_iterator(&this->group_tail);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->nodes);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->node_offsets);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->change_order);
  this->power = *(uint16_t *)
                 &((cnodes.
                    super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->sibling_connectors).
                  super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  this->ground = *(uint16_t *)
                  ((long)&((cnodes.
                            super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->sibling_connectors)
                          .
                          super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
                          ._M_impl.super__Vector_impl_data._M_start + 2);
  create_construct_nodes
            ((vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
              *)local_38,
             (chip_description *)
             cnodes.
             super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  setup_transistors((chip_description *)
                    cnodes.
                    super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                     *)local_38);
  create_nodes(&local_78,
               (vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                *)local_38);
  std::
  tie<std::vector<unsigned_short,std::allocator<unsigned_short>>,std::vector<unsigned_short,std::allocator<unsigned_short>>>
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_88,&this->node_offsets
            );
  std::
  tuple<std::vector<unsigned_short,std::allocator<unsigned_short>>&,std::vector<unsigned_short,std::allocator<unsigned_short>>&>
  ::operator=(local_88,&local_78);
  std::
  pair<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  ::~pair(&local_78);
  this->desc_nodes_count =
       *(uint16_t *)
        cnodes.
        super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  this->desc_transistor_count =
       *(uint16_t *)
        &((cnodes.
           super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage)->gates).
         super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  changed_queue_init(this);
  uVar1 = node_count(this);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&this->change_order,(ulong)uVar1);
  group_init(this);
  puVar2 = node_addr(this,this->power);
  *puVar2 = *puVar2 | 4;
  std::
  vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
  ::~vector((vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
             *)local_38);
  return;
}

Assistant:

nmos::nmos(const chip_description& desc):
    power(desc.node_power),
    ground(desc.node_ground)
{
    auto cnodes = create_construct_nodes(desc);
    setup_transistors(desc, cnodes);
    tie(node_offsets, nodes) = create_nodes(cnodes);
    desc_nodes_count = desc.node_count;
    desc_transistor_count = desc.transistor_count;
    changed_queue_init();
    change_order.resize(node_count());
    group_init();
    node_addr(power)[0] |= node_is_high;
}